

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextEx(char *text,char *text_end,ImGuiTextFlags flags)

{
  bool bVar1;
  size_t sVar2;
  ImVec2 *pIVar3;
  uint in_EDX;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  float fVar4;
  ImVec2 IVar5;
  ImRect bb_1;
  char *line_end_2;
  int lines_skipped_1;
  char *line_end_1;
  ImRect line_rect;
  char *line_end;
  int lines_skipped;
  int lines_skippable;
  ImVec2 pos;
  ImVec2 text_size_1;
  float line_height;
  char *line;
  ImRect bb;
  ImVec2 text_size;
  float wrap_width;
  bool wrap_enabled;
  float wrap_pos_x;
  ImVec2 text_pos;
  char *text_begin;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec4;
  ImVec2 *in_stack_fffffffffffffec8;
  ImRect *bb_00;
  float in_stack_fffffffffffffed4;
  float in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  ImVec2 *in_stack_fffffffffffffee0;
  ImVec2 in_stack_fffffffffffffee8;
  ImVec2 in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  ImVec2 in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  ImVec2 in_stack_ffffffffffffff10;
  int local_e4;
  float local_d8;
  ImVec2 *local_d0;
  ImRect local_c8;
  ImRect local_b8;
  ImVec2 local_a8;
  ImVec2 *local_a0;
  int local_94;
  int local_90;
  ImVec2 local_8c;
  ImVec2 local_84;
  float local_7c;
  ImVec2 *local_78;
  ImVec2 local_70;
  ImVec2 local_64;
  ImRect local_5c;
  ImVec2 local_4c;
  float local_44;
  undefined1 local_3d;
  float local_3c;
  ImVec2 local_38;
  ImVec2 *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  uint local_14;
  ImVec2 *local_10;
  ImVec2 *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    if (local_8 == local_10) {
      local_10 = (ImVec2 *)0x550b56;
      local_8 = (ImVec2 *)0x550b56;
    }
    local_30 = local_8;
    if (local_10 == (ImVec2 *)0x0) {
      in_stack_fffffffffffffee0 = local_8;
      sVar2 = strlen((char *)local_8);
      local_10 = (ImVec2 *)((long)&in_stack_fffffffffffffee0->x + sVar2);
    }
    ImVec2::ImVec2(&local_38,(local_20->DC).CursorPos.x,
                   (local_20->DC).CursorPos.y + (local_20->DC).CurrLineTextBaseOffset);
    local_3c = (local_20->DC).TextWrapPos;
    local_3d = 0.0 <= local_3c;
    if (((long)local_10 - (long)local_8 < 0x7d1) || ((bool)local_3d)) {
      if ((bool)local_3d) {
        fVar4 = CalcWrapWidthForPos(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      }
      else {
        fVar4 = 0.0;
      }
      local_44 = fVar4;
      local_4c = CalcTextSize((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                              SUB41((uint)fVar4 >> 0x18,0),in_stack_fffffffffffffed8);
      local_64 = ::operator+(in_stack_fffffffffffffeb8,(ImVec2 *)0x4e3dec);
      ImRect::ImRect(&local_5c,&local_38,&local_64);
      ItemSize(in_stack_fffffffffffffee0,fVar4);
      bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffee8,
                      (ImGuiID)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      (ImRect *)CONCAT44(fVar4,in_stack_fffffffffffffed8),
                      (ImGuiItemFlags)in_stack_fffffffffffffed4);
      if (bVar1) {
        local_70 = local_5c.Min;
        RenderTextWrapped(in_stack_ffffffffffffff00,
                          (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                          (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8.y);
      }
    }
    else {
      local_78 = local_8;
      local_7c = GetTextLineHeight();
      ImVec2::ImVec2(&local_84,0.0,0.0);
      local_8c.y = local_38.y;
      if (((local_28->LogEnabled & 1U) == 0) &&
         (local_90 = (int)(((local_20->ClipRect).Min.y - local_38.y) / local_7c), 0 < local_90)) {
        local_94 = 0;
        while( true ) {
          fVar4 = (float)((uint)in_stack_fffffffffffffed8 & 0xffffff);
          if (local_78 < local_10) {
            fVar4 = (float)CONCAT13(local_94 < local_90,SUB43(in_stack_fffffffffffffed8,0));
          }
          in_stack_fffffffffffffed8 = fVar4;
          if ((char)((uint)in_stack_fffffffffffffed8 >> 0x18) == '\0') break;
          local_a0 = (ImVec2 *)memchr(local_78,10,(long)local_10 - (long)local_78);
          if (local_a0 == (ImVec2 *)0x0) {
            local_a0 = local_10;
          }
          if ((local_14 & 1) == 0) {
            in_stack_fffffffffffffed4 = local_84.x;
            local_a8 = CalcTextSize((char *)in_stack_fffffffffffffee8,
                                    (char *)in_stack_fffffffffffffee0,
                                    SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),
                                    in_stack_fffffffffffffed8);
            local_84.x = ImMax<float>(in_stack_fffffffffffffed4,local_a8.x);
          }
          local_78 = (ImVec2 *)((long)&local_a0->x + 1);
          local_94 = local_94 + 1;
        }
        local_8c.y = (float)local_94 * local_7c + local_8c.y;
      }
      if (local_78 < local_10) {
        bb_00 = &local_c8;
        ImVec2::ImVec2(&bb_00->Min,3.4028235e+38,local_7c);
        local_c8.Max = ::operator+(in_stack_fffffffffffffeb8,(ImVec2 *)0x4e40a3);
        ImRect::ImRect(&local_b8,&local_8c,&local_c8.Max);
        while ((local_78 < local_10 &&
               (bVar1 = IsClippedEx(bb_00,(ImGuiID)in_stack_fffffffffffffec4), !bVar1))) {
          local_d0 = (ImVec2 *)memchr(local_78,10,(long)local_10 - (long)local_78);
          if (local_d0 == (ImVec2 *)0x0) {
            local_d0 = local_10;
          }
          in_stack_fffffffffffffec4 = local_84.x;
          IVar5 = CalcTextSize((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                               SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),
                               in_stack_fffffffffffffed8);
          local_d8 = IVar5.x;
          local_84.x = ImMax<float>(in_stack_fffffffffffffec4,local_d8);
          RenderText(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (char *)in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
          local_78 = (ImVec2 *)((long)&local_d0->x + 1);
          local_b8.Min.y = local_7c + local_b8.Min.y;
          local_b8.Max.y = local_7c + local_b8.Max.y;
          local_8c.y = local_7c + local_8c.y;
        }
        local_e4 = 0;
        while (local_78 < local_10) {
          pIVar3 = (ImVec2 *)memchr(local_78,10,(long)local_10 - (long)local_78);
          fVar4 = local_84.x;
          if (pIVar3 == (ImVec2 *)0x0) {
            pIVar3 = local_10;
          }
          if ((local_14 & 1) == 0) {
            IVar5 = CalcTextSize((char *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0
                                 ,SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0),
                                 in_stack_fffffffffffffed8);
            local_84.x = ImMax<float>(fVar4,IVar5.x);
          }
          local_e4 = local_e4 + 1;
          local_78 = (ImVec2 *)((long)&pIVar3->x + 1);
        }
        local_8c.y = (float)local_e4 * local_7c + local_8c.y;
      }
      pIVar3 = &local_38;
      IVar5 = ::operator-(pIVar3,(ImVec2 *)0x4e4331);
      local_84.y = IVar5.y;
      IVar5 = ::operator+(pIVar3,(ImVec2 *)0x4e4357);
      ImRect::ImRect((ImRect *)&stack0xfffffffffffffef0,&local_38,(ImVec2 *)&stack0xfffffffffffffee8
                    );
      ItemSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      ItemAdd((ImRect *)IVar5,(ImGuiID)((ulong)in_stack_fffffffffffffee0 >> 0x20),
              (ImRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
              (ImGuiItemFlags)in_stack_fffffffffffffed4);
    }
  }
  return;
}

Assistant:

void ImGui::TextEx(const char* text, const char* text_end, ImGuiTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    // Accept null ranges
    if (text == text_end)
        text = text_end = "";

    // Calculate length
    const char* text_begin = text;
    if (text_end == NULL)
        text_end = text + strlen(text); // FIXME-OPT

    const ImVec2 text_pos(window->DC.CursorPos.x, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
    const float wrap_pos_x = window->DC.TextWrapPos;
    const bool wrap_enabled = (wrap_pos_x >= 0.0f);
    if (text_end - text <= 2000 || wrap_enabled)
    {
        // Common case
        const float wrap_width = wrap_enabled ? CalcWrapWidthForPos(window->DC.CursorPos, wrap_pos_x) : 0.0f;
        const ImVec2 text_size = CalcTextSize(text_begin, text_end, false, wrap_width);

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size, 0.0f);
        if (!ItemAdd(bb, 0))
            return;

        // Render (we don't hide text after ## in this end-user function)
        RenderTextWrapped(bb.Min, text_begin, text_end, wrap_width);
    }
    else
    {
        // Long text!
        // Perform manual coarse clipping to optimize for long multi-line text
        // - From this point we will only compute the width of lines that are visible. Optimization only available when word-wrapping is disabled.
        // - We also don't vertically center the text within the line full height, which is unlikely to matter because we are likely the biggest and only item on the line.
        // - We use memchr(), pay attention that well optimized versions of those str/mem functions are much faster than a casually written loop.
        const char* line = text;
        const float line_height = GetTextLineHeight();
        ImVec2 text_size(0, 0);

        // Lines to skip (can't skip when logging text)
        ImVec2 pos = text_pos;
        if (!g.LogEnabled)
        {
            int lines_skippable = (int)((window->ClipRect.Min.y - text_pos.y) / line_height);
            if (lines_skippable > 0)
            {
                int lines_skipped = 0;
                while (line < text_end && lines_skipped < lines_skippable)
                {
                    const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                    if (!line_end)
                        line_end = text_end;
                    if ((flags & ImGuiTextFlags_NoWidthForLargeClippedText) == 0)
                        text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                    line = line_end + 1;
                    lines_skipped++;
                }
                pos.y += lines_skipped * line_height;
            }
        }

        // Lines to render
        if (line < text_end)
        {
            ImRect line_rect(pos, pos + ImVec2(FLT_MAX, line_height));
            while (line < text_end)
            {
                if (IsClippedEx(line_rect, 0))
                    break;

                const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                if (!line_end)
                    line_end = text_end;
                text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                RenderText(pos, line, line_end, false);
                line = line_end + 1;
                line_rect.Min.y += line_height;
                line_rect.Max.y += line_height;
                pos.y += line_height;
            }

            // Count remaining lines
            int lines_skipped = 0;
            while (line < text_end)
            {
                const char* line_end = (const char*)memchr(line, '\n', text_end - line);
                if (!line_end)
                    line_end = text_end;
                if ((flags & ImGuiTextFlags_NoWidthForLargeClippedText) == 0)
                    text_size.x = ImMax(text_size.x, CalcTextSize(line, line_end).x);
                line = line_end + 1;
                lines_skipped++;
            }
            pos.y += lines_skipped * line_height;
        }
        text_size.y = (pos - text_pos).y;

        ImRect bb(text_pos, text_pos + text_size);
        ItemSize(text_size, 0.0f);
        ItemAdd(bb, 0);
    }
}